

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddPermuteWindow3(DdManager *table,int x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_30;
  int best;
  int sizeNew;
  int size;
  int z;
  int y;
  int x_local;
  DdManager *table_local;
  
  best = table->keys - table->isolated;
  iVar1 = x + 1;
  iVar2 = x + 2;
  local_30 = 1;
  iVar3 = cuddSwapInPlace(table,x,iVar1);
  if (iVar3 < best) {
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = 2;
    best = iVar3;
  }
  iVar3 = cuddSwapInPlace(table,iVar1,iVar2);
  if (iVar3 < best) {
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = 3;
    best = iVar3;
  }
  iVar3 = cuddSwapInPlace(table,x,iVar1);
  if (iVar3 < best) {
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = 4;
    best = iVar3;
  }
  iVar3 = cuddSwapInPlace(table,iVar1,iVar2);
  if (iVar3 < best) {
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = 5;
    best = iVar3;
  }
  iVar3 = cuddSwapInPlace(table,x,iVar1);
  if (iVar3 < best) {
    if (iVar3 == 0) {
      return 0;
    }
    local_30 = 6;
  }
  switch(local_30) {
  case 2:
    iVar2 = cuddSwapInPlace(table,iVar1,iVar2);
    if (iVar2 == 0) {
      return 0;
    }
switchD_00c0caa2_caseD_5:
    iVar1 = cuddSwapInPlace(table,x,iVar1);
    if (iVar1 == 0) {
      table_local._4_4_ = 0;
    }
    else {
LAB_00c0cb4d:
      table_local._4_4_ = local_30;
    }
    return table_local._4_4_;
  case 3:
    iVar3 = cuddSwapInPlace(table,iVar1,iVar2);
    if (iVar3 == 0) {
      return 0;
    }
  case 4:
    iVar3 = cuddSwapInPlace(table,x,iVar1);
    if (iVar3 == 0) {
      return 0;
    }
  case 1:
    iVar1 = cuddSwapInPlace(table,iVar1,iVar2);
    if (iVar1 == 0) {
      return 0;
    }
  case 6:
    goto LAB_00c0cb4d;
  case 5:
    goto switchD_00c0caa2_caseD_5;
  default:
    return 0;
  }
}

Assistant:

static int
ddPermuteWindow3(
  DdManager * table,
  int  x)
{
    int y,z;
    int size,sizeNew;
    int best;

#ifdef DD_DEBUG
    assert(table->dead == 0);
    assert(x+2 < table->size);
#endif

    size = table->keys - table->isolated;
    y = x+1; z = y+1;

    /* The permutation pattern is:
    ** (x,y)(y,z)
    ** repeated three times to get all 3! = 6 permutations.
    */
#define ABC 1
    best = ABC;

#define BAC 2
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BAC;
        size = sizeNew;
    }
#define BCA 3
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BCA;
        size = sizeNew;
    }
#define CBA 4
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = CBA;
        size = sizeNew;
    }
#define CAB 5
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = CAB;
        size = sizeNew;
    }
#define ACB 6
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = ACB;
        size = sizeNew;
    }

    /* Now take the shortest route to the best permuytation.
    ** The initial permutation is ACB.
    */
    switch(best) {
    case BCA: if (!cuddSwapInPlace(table,y,z)) return(0);
    case CBA: if (!cuddSwapInPlace(table,x,y)) return(0);
    case ABC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case ACB: break;
    case BAC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case CAB: if (!cuddSwapInPlace(table,x,y)) return(0);
               break;
    default: return(0);
    }

#ifdef DD_DEBUG
    assert(table->keys - table->isolated == (unsigned) size);
#endif

    return(best);

}